

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

void R_DeinitColormaps(void)

{
  TArray<FSpecialColormap,_FSpecialColormap>::Clear(&SpecialColormaps);
  TArray<FakeCmap,_FakeCmap>::Clear(&fakecmaps);
  if (realcolormaps != (BYTE *)0x0) {
    if (realcolormaps != (BYTE *)0x0) {
      operator_delete__(realcolormaps);
    }
    realcolormaps = (BYTE *)0x0;
  }
  if (realfbcolormaps != (BYTE *)0x0) {
    if (realfbcolormaps != (BYTE *)0x0) {
      operator_delete__(realfbcolormaps);
    }
    realfbcolormaps = (BYTE *)0x0;
  }
  FreeSpecialLights();
  return;
}

Assistant:

void R_DeinitColormaps ()
{
	SpecialColormaps.Clear();
	fakecmaps.Clear();
	if (realcolormaps != NULL)
	{
		delete[] realcolormaps;
		realcolormaps = NULL;
	}
	if (realfbcolormaps != NULL)
	{
		delete[] realfbcolormaps;
		realfbcolormaps = NULL;
	}
	FreeSpecialLights();
}